

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::ImageInfiniteLight::PDF_Le(ImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float *in_RCX;
  float *in_RDX;
  long in_RDI;
  Float FVar1;
  float fVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  float fVar7;
  Vector3<float> VVar8;
  Float mapPDF;
  Vector3f wl;
  Vector3<float> *in_stack_00000088;
  Transform *in_stack_00000090;
  Tuple3<pbrt::Vector3,_float> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffac;
  PiecewiseConstant2D *this_00;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 extraout_var [56];
  
  auVar6 = in_ZMM0._8_56_;
  VVar8 = Transform::ApplyInverse<float>(in_stack_00000090,in_stack_00000088);
  fVar2 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar6;
  this_00 = (PiecewiseConstant2D *)vmovlpd_avx(auVar3._0_16_);
  VVar8 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_ffffffffffffff80);
  fVar7 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  vmovlpd_avx(auVar4._0_16_);
  auVar5._0_8_ = EqualAreaSphereToSquare((Vector3f *)CONCAT44(in_stack_ffffffffffffffcc,fVar2));
  auVar5._8_56_ = extraout_var;
  vmovlpd_avx(auVar5._0_16_);
  FVar1 = PiecewiseConstant2D::PDF(this_00,(Point2f *)CONCAT44(in_stack_ffffffffffffffac,fVar7));
  *in_RCX = FVar1 / 12.566371;
  fVar2 = Sqr<float>(*(float *)(in_RDI + 0x1f0));
  *in_RDX = 1.0 / (fVar2 * 3.1415927);
  return;
}

Assistant:

void ImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    Vector3f wl = -renderFromLight.ApplyInverse(ray.d);
    Float mapPDF = distribution.PDF(EqualAreaSphereToSquare(wl));
    *pdfDir = mapPDF / (4 * Pi);
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
}